

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O3

void printBits(ostream *os,float f)

{
  int i;
  uint uVar1;
  bool bVar2;
  byte local_2a [2];
  
  uVar1 = 0x1f;
  do {
    local_2a[0] = ((uint)f >> (uVar1 & 0x1f) & 1) == 0 ^ 0x31;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_2a,1);
    if ((uVar1 & 0x7ffffff7) == 0x17) {
      local_2a[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(local_2a + 1),1);
    }
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  return;
}

Assistant:

IMATH_EXPORT void
printBits (ostream& os, float f)
{
    half::uif x;
    x.f = f;

    for (int i = 31; i >= 0; i--)
    {
        os << (((x.i >> i) & 1) ? '1' : '0');

        if (i == 31 || i == 23) os << ' ';
    }
}